

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result wabt::ParseWastScript
                 (WastLexer *lexer,
                 unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *out_script,
                 Errors *errors,WastParseOptions *options)

{
  Result RVar1;
  undefined1 local_100 [8];
  WastParser parser;
  WastParseOptions *options_local;
  Errors *errors_local;
  unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *out_script_local;
  WastLexer *lexer_local;
  
  parser.tokens_.front_ = (size_type)options;
  if (out_script != (unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *)0x0) {
    WastParser::WastParser((WastParser *)local_100,lexer,errors,options);
    RVar1 = WastParser::ParseScript((WastParser *)local_100,out_script);
    WastParser::~WastParser((WastParser *)local_100);
    return (Result)RVar1.enum_;
  }
  __assert_fail("out_script != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/wast-parser.cc"
                ,0x9a9,
                "Result wabt::ParseWastScript(WastLexer *, std::unique_ptr<Script> *, Errors *, WastParseOptions *)"
               );
}

Assistant:

Result ParseWastScript(WastLexer* lexer,
                       std::unique_ptr<Script>* out_script,
                       Errors* errors,
                       WastParseOptions* options) {
  assert(out_script != nullptr);
  WastParser parser(lexer, errors, options);
  return parser.ParseScript(out_script);
}